

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

RepeatedField<long> * __thiscall
google::protobuf::Reflection::GetRepeatedField<long>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  RepeatedField<long> *pRVar1;
  Descriptor *in_stack_00000068;
  int in_stack_00000070;
  CppType in_stack_00000074;
  FieldDescriptor *in_stack_00000078;
  Message *in_stack_00000080;
  Reflection *in_stack_00000088;
  
  pRVar1 = (RepeatedField<long> *)
           MutableRawRepeatedField
                     (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000074,
                      in_stack_00000070,in_stack_00000068);
  return pRVar1;
}

Assistant:

HANDLE_TYPE(float, FieldDescriptor::CPPTYPE_FLOAT, -1);
HANDLE_TYPE(double, FieldDescriptor::CPPTYPE_DOUBLE, -1);
HANDLE_TYPE(bool, FieldDescriptor::CPPTYPE_BOOL, -1);


#undef HANDLE_TYPE

void* Reflection::MutableRawRepeatedString(Message* message,
                                           const FieldDescriptor* field,
                                           bool is_string) const {
  return MutableRawRepeatedField(message, field,
                                 FieldDescriptor::CPPTYPE_STRING,
                                 FieldOptions::STRING, NULL);
}

// Template implementations of basic accessors.  Inline because each
// template instance is only called from one location.  These are
// used for all types except messages.
template <typename Type>
const Type& Reflection::GetField(const Message& message,
                                 const FieldDescriptor* field) const {
  return GetRaw<Type>(message, field);
}